

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O1

QRect __thiscall QWidgetPrivate::effectiveRectFor(QWidgetPrivate *this,QRect *rect)

{
  bool bVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->graphicsEffect != (QGraphicsEffect *)0x0) {
    bVar1 = QGraphicsEffect::isEnabled(this->graphicsEffect);
    if (bVar1) {
      (**(code **)(*(long *)this->graphicsEffect + 0x60))(local_38);
      QVar2 = (QRect)QRectF::toAlignedRect();
      goto LAB_0031f6bc;
    }
  }
  QVar2 = *rect;
LAB_0031f6bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline QRect effectiveRectFor(const QRect &rect) const
    {
#if QT_CONFIG(graphicseffect)
        if (graphicsEffect && graphicsEffect->isEnabled())
            return graphicsEffect->boundingRectFor(rect).toAlignedRect();
#endif // QT_CONFIG(graphicseffect)
        return rect;
    }